

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  U32 *pUVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  U32 UVar13;
  ulong uVar14;
  U32 *pUVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  
  pBVar1 = (ms->window).base;
  uVar8 = (ms->cParams).chainLog;
  uVar19 = 1 << ((byte)uVar8 & 0x1f);
  uVar14 = (long)ip - (long)pBVar1;
  uVar24 = ms->nextToUpdate;
  uVar11 = (ulong)uVar24;
  uVar12 = (uint)uVar14;
  uVar9 = uVar12 - uVar19;
  if (uVar12 - uVar24 <= uVar19) {
    uVar9 = uVar24;
  }
  uVar16 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  uVar21 = 0xff;
  if (uVar16 < 0xff) {
    uVar21 = uVar16;
  }
  uVar18 = (ms->cParams).hashLog;
  uVar7 = uVar18 - 2;
  bVar6 = (byte)uVar7;
  lVar17 = 1L << (bVar6 & 0x3f);
  uVar5 = 3 << (bVar6 & 0x1f);
  uVar23 = uVar12 - uVar5;
  if (uVar12 < uVar5 || uVar23 == 0) {
    uVar23 = uVar24;
  }
  if (0x18 < uVar8) {
    __assert_fail("ms->cParams.chainLog <= 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x751f,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar18 <= uVar8) {
    __assert_fail("ms->cParams.hashLog > ms->cParams.chainLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7520,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar11 == 0) {
    __assert_fail("idx != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7521,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar9 < uVar23) {
    __assert_fail("tmpMinChain <= minChain",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7522,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  pUVar2 = ms->hashTable;
  pUVar15 = ms->chainTable;
  cVar3 = (char)uVar18;
  if (uVar24 < uVar12) {
    if (0x20 < uVar7) goto LAB_0018c025;
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e4432345000000;
        break;
      case 6:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e4432340650000;
        break;
      case 7:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e44323485a9b9d;
        break;
      default:
        uVar25 = (ulong)((uint)(*(int *)(pBVar1 + uVar11) * -0x61c8864f) >> (0x22U - cVar3 & 0x1f));
        goto LAB_0018bd2f;
      }
      uVar25 = uVar25 >> (0x42U - cVar3 & 0x3f);
LAB_0018bd2f:
      if (uVar23 <= uVar11) {
        pUVar2[lVar17 + (ulong)((U32)uVar11 - uVar23)] = pUVar2[uVar25 & 0xffffffff];
      }
      pUVar2[uVar25 & 0xffffffff] = (U32)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (uVar14 & 0xffffffff));
  }
  uVar8 = 1 << (bVar6 & 0x1f);
  uVar25 = (ulong)uVar8;
  iVar22 = uVar21 + (uVar21 == 0);
  uVar11 = 0;
  uVar24 = 0;
  do {
    uVar21 = pUVar2[uVar11];
    bVar26 = true;
    uVar18 = 0;
    if (uVar23 <= uVar21) {
      uVar5 = 0;
      do {
        uVar18 = uVar18 + (uVar21 < uVar9);
        uVar10 = uVar5 + 1;
        uVar21 = pUVar2[lVar17 + (ulong)(uVar21 - uVar23)];
        if (uVar21 < uVar23) break;
        bVar26 = uVar5 < 2;
        uVar5 = uVar10;
      } while (bVar26);
      bVar26 = uVar10 != 3 || uVar16 == 0;
    }
    iVar20 = 0;
    if (!bVar26) {
      iVar20 = 0;
      uVar5 = uVar24;
      do {
        uVar24 = uVar5;
        if ((uVar21 < uVar9) && ((uVar21 == 0 || (uVar18 = uVar18 + 1, 3 < uVar18))))
        goto LAB_0018be11;
        pUVar15[uVar24] = uVar21;
        iVar20 = iVar20 + 1;
        iVar4 = iVar20;
        if (uVar21 < uVar23) break;
        uVar21 = pUVar2[lVar17 + (ulong)(uVar21 - uVar23)];
        uVar5 = uVar24 + 1;
        iVar4 = iVar22;
      } while (iVar22 != iVar20);
      iVar20 = iVar4;
      uVar24 = uVar24 + 1;
    }
LAB_0018be11:
    UVar13 = uVar24 * 0x100 + iVar20 * -0xff;
    if (iVar20 == 0) {
      UVar13 = 0;
    }
    pUVar2[uVar11] = UVar13;
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar25);
  if (uVar19 < uVar24) {
    __assert_fail("chainPos <= chainSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x755b,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  uVar24 = 4 << (bVar6 & 0x1f);
  pUVar15 = pUVar2 + (uVar8 - 1);
  uVar8 = uVar8 * 4 - 1;
  do {
    uVar24 = uVar24 - 4;
    UVar13 = *pUVar15;
    pUVar15 = pUVar15 + -1;
    uVar11 = (ulong)uVar8;
    uVar8 = uVar8 - 4;
    pUVar2[(ulong)uVar24 + 2] = 0;
    (pUVar2 + uVar24)[0] = 0;
    (pUVar2 + uVar24)[1] = 0;
    pUVar2[uVar11] = UVar13;
    uVar9 = (int)uVar25 - 1;
    uVar25 = (ulong)uVar9;
  } while (uVar9 != 0);
  uVar11 = (ulong)ms->nextToUpdate;
  if (ms->nextToUpdate < uVar12) {
    if (0x20 < uVar7) {
LAB_0018c025:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    do {
      bVar6 = 0x42 - cVar3;
      switch((ms->cParams).minMatch) {
      case 5:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e4432345000000;
        bVar6 = 0x42 - cVar3;
        break;
      case 6:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e4432340650000;
        break;
      case 7:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar25 = *(long *)(pBVar1 + uVar11) * -0x30e44323485a9b9d;
        bVar6 = 0x42 - cVar3;
        break;
      default:
        uVar8 = (uint)(*(int *)(pBVar1 + uVar11) * -0x61c8864f) >> (0x22U - cVar3 & 0x1f);
        goto LAB_0018bf47;
      }
      uVar8 = (uint)(uVar25 >> (bVar6 & 0x3f));
LAB_0018bf47:
      uVar25 = (ulong)(uVar8 << 2);
      *(undefined8 *)(pUVar2 + uVar25 + 1) = *(undefined8 *)(pUVar2 + uVar25);
      pUVar2[uVar25] = (U32)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (uVar14 & 0xffffffff));
  }
  ms->nextToUpdate = uVar12;
  return;
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target - idx ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = (U32)((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}